

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseJsonAsValue(Value *ret,json *o)

{
  pointer *this;
  primitive_iterator_t *this_00;
  value_t vVar1;
  bool bVar2;
  char cVar3;
  key_type *__args;
  size_type sVar4;
  size_type sVar5;
  reference pbVar6;
  long lVar7;
  double n;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_bool>
  pVar8;
  Value local_6b8;
  Value local_620;
  Value local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  Value local_4d0;
  Value local_438;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_3a0;
  undefined1 local_380 [8];
  Value entry_1;
  undefined1 local_2c8 [8];
  const_iterator it_1;
  Array value_array;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1f8;
  _Base_ptr local_1d8;
  undefined1 local_1d0;
  undefined1 local_1c8 [8];
  Value entry;
  const_iterator local_120;
  undefined1 local_100 [8];
  const_iterator it;
  Object value_object;
  Value val;
  json *o_local;
  Value *ret_local;
  
  Value::Value((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count);
  vVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::type(o);
  switch(vVar1) {
  case null:
  case discarded:
    break;
  case object:
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
           *)&it.m_it.primitive_iterator);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin((const_iterator *)local_100,o);
    while( true ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end(&local_120,o);
      bVar2 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_100,&local_120);
      if (!bVar2) break;
      Value::Value((Value *)local_1c8);
      pbVar6 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::value((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_100);
      ParseJsonAsValue((Value *)local_1c8,pbVar6);
      cVar3 = Value::Type((Value *)local_1c8);
      if (cVar3 != '\0') {
        __args = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_100);
        pVar8 = std::
                map<std::__cxx11::string,tinygltf::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                ::emplace<std::__cxx11::string_const&,tinygltf::Value>
                          ((map<std::__cxx11::string,tinygltf::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                            *)&it.m_it.primitive_iterator,__args,(Value *)local_1c8);
        local_1d8 = (_Base_ptr)pVar8.first._M_node;
        local_1d0 = pVar8.second;
      }
      Value::~Value((Value *)local_1c8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_1f8,
                   (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)local_100,0);
    }
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
                    *)&it.m_it.primitive_iterator);
    if (sVar4 != 0) {
      this = &value_array.super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      Value::Value((Value *)this,(Object *)&it.m_it.primitive_iterator);
      Value::operator=((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (Value *)this);
      Value::~Value((Value *)&value_array.
                              super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
            *)&it.m_it.primitive_iterator);
    break;
  case array:
    this_00 = &it_1.m_it.primitive_iterator;
    std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::vector
              ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)this_00);
    sVar5 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::size(o);
    std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::reserve
              ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)this_00,sVar5);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::begin((const_iterator *)local_2c8,o);
    while( true ) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((const_iterator *)&entry_1.boolean_value_,o);
      bVar2 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_2c8,
                           (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&entry_1.boolean_value_);
      if (!bVar2) break;
      Value::Value((Value *)local_380);
      pbVar6 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::value((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_2c8);
      ParseJsonAsValue((Value *)local_380,pbVar6);
      cVar3 = Value::Type((Value *)local_380);
      if (cVar3 != '\0') {
        std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::
        emplace_back<tinygltf::Value>
                  ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)
                   &it_1.m_it.primitive_iterator,(Value *)local_380);
      }
      Value::~Value((Value *)local_380);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_3a0,
                   (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)local_2c8,0);
    }
    sVar5 = std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::size
                      ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)
                       &it_1.m_it.primitive_iterator);
    if (sVar5 != 0) {
      Value::Value(&local_438,(Array *)&it_1.m_it.primitive_iterator);
      Value::operator=((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &local_438);
      Value::~Value(&local_438);
    }
    std::vector<tinygltf::Value,_std::allocator<tinygltf::Value>_>::~vector
              ((vector<tinygltf::Value,_std::allocator<tinygltf::Value>_> *)
               &it_1.m_it.primitive_iterator);
    break;
  case string:
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_4f0,o);
    Value::Value(&local_4d0,&local_4f0);
    Value::operator=((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     &local_4d0);
    Value::~Value(&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    break;
  case boolean:
    bVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<bool,_bool,_0>(o);
    Value::Value(&local_588,bVar2);
    Value::operator=((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     &local_588);
    Value::~Value(&local_588);
    break;
  case number_integer:
  case number_unsigned:
    lVar7 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<long,_long,_0>(o);
    Value::Value(&local_620,(int)lVar7);
    Value::operator=((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     &local_620);
    Value::~Value(&local_620);
    break;
  case number_float:
    n = nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::get<double,_double,_0>(o);
    Value::Value(&local_6b8,n);
    Value::operator=((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     &local_6b8);
    Value::~Value(&local_6b8);
  }
  if (ret != (Value *)0x0) {
    Value::operator=(ret,(Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  cVar3 = Value::Type((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Value::~Value((Value *)&value_object._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return cVar3 != '\0';
}

Assistant:

static bool ParseJsonAsValue(Value *ret, const json &o) {
  Value val{};
#ifdef TINYGLTF_USE_RAPIDJSON
  using rapidjson::Type;
  switch (o.GetType()) {
    case Type::kObjectType: {
      Value::Object value_object;
      for (auto it = o.MemberBegin(); it != o.MemberEnd(); ++it) {
        Value entry;
        ParseJsonAsValue(&entry, it->value);
        if (entry.Type() != NULL_TYPE)
          value_object.emplace(GetKey(it), std::move(entry));
      }
      if (value_object.size() > 0) val = Value(std::move(value_object));
    } break;
    case Type::kArrayType: {
      Value::Array value_array;
      value_array.reserve(o.Size());
      for (auto it = o.Begin(); it != o.End(); ++it) {
        Value entry;
        ParseJsonAsValue(&entry, *it);
        if (entry.Type() != NULL_TYPE)
          value_array.emplace_back(std::move(entry));
      }
      if (value_array.size() > 0) val = Value(std::move(value_array));
    } break;
    case Type::kStringType:
      val = Value(std::string(o.GetString()));
      break;
    case Type::kFalseType:
    case Type::kTrueType:
      val = Value(o.GetBool());
      break;
    case Type::kNumberType:
      if (!o.IsDouble()) {
        int i = 0;
        GetInt(o, i);
        val = Value(i);
      } else {
        double d = 0.0;
        GetDouble(o, d);
        val = Value(d);
      }
      break;
    case Type::kNullType:
    default:
      // default:
      break;
  }
#else
  switch (o.type()) {
    case json::value_t::object: {
      Value::Object value_object;
      for (auto it = o.begin(); it != o.end(); it++) {
        Value entry;
        ParseJsonAsValue(&entry, it.value());
        if (entry.Type() != NULL_TYPE)
          value_object.emplace(it.key(), std::move(entry));
      }
      if (value_object.size() > 0) val = Value(std::move(value_object));
    } break;
    case json::value_t::array: {
      Value::Array value_array;
      value_array.reserve(o.size());
      for (auto it = o.begin(); it != o.end(); it++) {
        Value entry;
        ParseJsonAsValue(&entry, it.value());
        if (entry.Type() != NULL_TYPE)
          value_array.emplace_back(std::move(entry));
      }
      if (value_array.size() > 0) val = Value(std::move(value_array));
    } break;
    case json::value_t::string:
      val = Value(o.get<std::string>());
      break;
    case json::value_t::boolean:
      val = Value(o.get<bool>());
      break;
    case json::value_t::number_integer:
    case json::value_t::number_unsigned:
      val = Value(static_cast<int>(o.get<int64_t>()));
      break;
    case json::value_t::number_float:
      val = Value(o.get<double>());
      break;
    case json::value_t::null:
    case json::value_t::discarded:
      // default:
      break;
  }
#endif
  if (ret) *ret = std::move(val);

  return val.Type() != NULL_TYPE;
}